

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O1

void __thiscall QUrlQueryPrivate::addQueryItem(QUrlQueryPrivate *this,QString *key,QString *value)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Data *pDVar7;
  int *piVar8;
  qsizetype qVar9;
  qsizetype qVar10;
  char16_t *pcVar11;
  QArrayData *pQVar12;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  QStringView in;
  QStringView in_00;
  pair<QString,_QString> local_88;
  undefined1 local_58 [12];
  undefined4 uStack_4c;
  qsizetype local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _local_58 = ZEXT816(0);
  local_48 = 0;
  uVar1 = this->valueDelimiter;
  uVar3 = this->pairDelimiter;
  uVar5 = *(undefined4 *)&this->field_0x24;
  auVar13._4_4_ = uVar5;
  auVar13._2_2_ = uVar3;
  auVar13._0_2_ = uVar1;
  auVar13._8_8_ = 0;
  auVar13 = pshuflw(auVar13,auVar13,0xe1);
  _local_40 = CONCAT44(0x23,auVar13._0_4_);
  in.m_data = (key->d).ptr;
  in.m_size = (key->d).size;
  qVar9 = qt_urlRecode((QString *)local_58,in,(ComponentFormattingOptions)0x2000000,
                       (ushort *)&local_40);
  qVar10 = local_48;
  if (qVar9 == 0) {
    pQVar12 = &((key->d).d)->super_QArrayData;
    pcVar11 = (key->d).ptr;
    qVar10 = (key->d).size;
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&pQVar12->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&pQVar12->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    pQVar12 = (QArrayData *)local_58._0_8_;
    pcVar11 = stack0xffffffffffffffb0;
    _local_58 = (undefined1  [16])0x0;
    local_48 = 0;
  }
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  _local_58 = (undefined1  [16])0x0;
  local_48 = 0;
  uVar2 = this->valueDelimiter;
  uVar4 = this->pairDelimiter;
  uVar6 = *(undefined4 *)&this->field_0x24;
  auVar14._4_4_ = uVar6;
  auVar14._2_2_ = uVar4;
  auVar14._0_2_ = uVar2;
  auVar14._8_8_ = 0;
  auVar13 = pshuflw(auVar14,auVar14,0xe1);
  _local_40 = CONCAT44(0x23,auVar13._0_4_);
  in_00.m_data = (value->d).ptr;
  in_00.m_size = (value->d).size;
  qVar9 = qt_urlRecode((QString *)local_58,in_00,(ComponentFormattingOptions)0x2000000,
                       (ushort *)&local_40);
  local_88.second.d.size = local_48;
  if (qVar9 == 0) {
    uVar15 = *(undefined4 *)&(value->d).d;
    uVar16 = *(undefined4 *)((long)&(value->d).d + 4);
    uVar17 = *(undefined4 *)&(value->d).ptr;
    uVar18 = *(undefined4 *)((long)&(value->d).ptr + 4);
    pDVar7 = (value->d).d;
    local_88.second.d.size = (value->d).size;
    if (pDVar7 != (Data *)0x0) {
      LOCK();
      (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    uVar15 = local_58._0_4_;
    uVar16 = local_58._4_4_;
    uVar17 = local_58._8_4_;
    uVar18 = uStack_4c;
    _local_58 = (undefined1  [16])0x0;
    local_48 = 0;
  }
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  local_88.first.d.d = (Data *)pQVar12;
  local_88.first.d.ptr = pcVar11;
  local_88.first.d.size = qVar10;
  local_88.second.d.d._0_4_ = uVar15;
  local_88.second.d.d._4_4_ = uVar16;
  local_88.second.d.ptr._0_4_ = uVar17;
  local_88.second.d.ptr._4_4_ = uVar18;
  QtPrivate::QMovableArrayOps<std::pair<QString,QString>>::emplace<std::pair<QString,QString>>
            ((QMovableArrayOps<std::pair<QString,QString>> *)&this->itemList,(this->itemList).d.size
             ,&local_88);
  QList<std::pair<QString,_QString>_>::end(&this->itemList);
  piVar8 = (int *)CONCAT44(local_88.second.d.d._4_4_,local_88.second.d.d._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_88.second.d.d._4_4_,local_88.second.d.d._0_4_),2,0x10)
      ;
    }
  }
  if (&(local_88.first.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.first.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void addQueryItem(const QString &key, const QString &value)
    { itemList.append(std::make_pair(recodeFromUser(key), recodeFromUser(value))); }